

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_suba_32_pcix(void)

{
  int *piVar1;
  uint addr_in;
  uint uVar2;
  
  m68ki_address_space = 2;
  addr_in = m68ki_get_ea_ix(m68ki_cpu.pc);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_32(addr_in & m68ki_cpu.address_mask);
  piVar1 = (int *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c) + 0x20);
  *piVar1 = *piVar1 - uVar2;
  return;
}

Assistant:

static void m68k_op_suba_32_pcix(void)
{
	uint src = OPER_PCIX_32();
	uint* r_dst = &AX;

	*r_dst = MASK_OUT_ABOVE_32(*r_dst - src);
}